

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

int process_pass(vw *all,bfgs *b)

{
  pointer pcVar1;
  shared_data *psVar2;
  int iVar3;
  anon_union_4_2_947300a4 x_1;
  float fVar4;
  double dVar5;
  anon_union_4_2_947300a4 x;
  double wolfe1;
  string local_50;
  double local_30;
  
  finalize_preconditioner(all,b,all->l2_lambda);
  if (b->first_pass == true) {
    if (all->all_reduce != (AllReduce *)0x0) {
      accumulate(all,&all->weights,3);
      fVar4 = accumulate_scalar(all,(float)b->importance_weight_sum);
      b->importance_weight_sum = (double)fVar4;
    }
    if (all->all_reduce != (AllReduce *)0x0) {
      fVar4 = accumulate_scalar(all,(float)b->loss_sum);
      b->loss_sum = (double)fVar4;
      accumulate(all,&all->weights,1);
    }
    if (0.0 < all->l2_lambda) {
      dVar5 = add_regularization(all,b,all->l2_lambda);
      b->loss_sum = dVar5 + b->loss_sum;
    }
    if (all->quiet == false) {
      process_pass();
    }
    b->previous_loss_sum = b->loss_sum;
    iVar3 = 0;
    b->loss_sum = 0.0;
    b->example_number = 0;
    b->curvature = 0.0;
    bfgs_iter_start(all,b,b->mem,&b->lastj,b->importance_weight_sum,&b->origin);
    if (b->first_hessian_on != true) {
      b->step_size = 0.5;
      direction_magnitude(all);
      ftime(&b->t_end_global);
      b->net_time = (double)(int)((double)((b->t_end_global).time - (b->t_start_global).time) *
                                  1000.0 + (double)(int)((uint)(b->t_end_global).millitm -
                                                        (uint)(b->t_start_global).millitm));
      if (all->quiet == false) {
        process_pass();
      }
      v_array<float>::clear(&b->predictions);
      update_weight(all,b->step_size);
LAB_001b35a4:
      iVar3 = 0;
      goto LAB_001b3999;
    }
  }
  else {
    if (b->gradient_pass != true) {
      if (all->all_reduce != (AllReduce *)0x0) {
        fVar4 = accumulate_scalar(all,(float)b->curvature);
        b->curvature = (double)fVar4;
      }
      if (0.0 < all->l2_lambda) {
        dVar5 = regularizer_direction_magnitude(all,b,all->l2_lambda);
        b->curvature = dVar5 + b->curvature;
      }
      dVar5 = derivative_in_direction(all,b,b->mem,&b->origin);
      fVar4 = (float)dVar5;
      dVar5 = b->curvature;
      if (((dVar5 != 0.0) || (NAN(dVar5))) || ((fVar4 == 0.0 && (!NAN(fVar4))))) {
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          fVar4 = -fVar4 / (float)dVar5;
          iVar3 = 0;
        }
        else {
          fwrite("Derivative 0 detected.\n",0x17,1,_stdout);
          fVar4 = 0.0;
          iVar3 = 2;
        }
      }
      else {
        fputs(curv_message,_stdout);
        fVar4 = 0.0;
        iVar3 = 1;
      }
      b->step_size = fVar4;
      fVar4 = direction_magnitude(all);
      v_array<float>::clear(&b->predictions);
      update_weight(all,b->step_size);
      ftime(&b->t_end_global);
      b->net_time = (double)(int)((double)((b->t_end_global).time - (b->t_start_global).time) *
                                  1000.0 + (double)(int)((uint)(b->t_end_global).millitm -
                                                        (uint)(b->t_start_global).millitm));
      if (all->quiet == false) {
        fprintf(_stderr,"%-10.5f\t%-10.5f\t%-.5f\n",SUB84(b->curvature / b->importance_weight_sum,0)
                ,(double)fVar4,SUB84((double)b->step_size,0));
      }
      b->gradient_pass = true;
      goto LAB_001b3999;
    }
    if (all->all_reduce != (AllReduce *)0x0) {
      fVar4 = accumulate_scalar(all,(float)b->loss_sum);
      b->loss_sum = (double)fVar4;
      accumulate(all,&all->weights,1);
    }
    if (0.0 < all->l2_lambda) {
      dVar5 = add_regularization(all,b,all->l2_lambda);
      b->loss_sum = dVar5 + b->loss_sum;
    }
    if (all->quiet == false) {
      if ((all->holdout_set_off == false) && (b->current_pass != 0)) {
        psVar2 = all->sd;
        dVar5 = psVar2->holdout_sum_loss_since_last_pass;
        if ((dVar5 != 0.0) ||
           (((NAN(dVar5) || (psVar2->weighted_holdout_examples_since_last_pass != 0.0)) ||
            (NAN(psVar2->weighted_holdout_examples_since_last_pass))))) {
          fprintf(_stderr,"%2lu h%-10.5f\t",
                  SUB84(dVar5 / psVar2->weighted_holdout_examples_since_last_pass,0),
                  b->current_pass + 1);
        }
        else {
          process_pass();
        }
      }
      else {
        process_pass();
      }
    }
    dVar5 = wolfe_eval(all,b,b->mem,b->loss_sum,b->previous_loss_sum,(double)b->step_size,
                       b->importance_weight_sum,&b->origin,&local_30);
    if ((~(uint)(float)local_30 & 0x7fc00000) == 0) {
      fputc(10,_stderr);
      fwrite("Derivative 0 detected.\n",0x17,1,_stdout);
      b->step_size = 0.0;
      iVar3 = 2;
      goto LAB_001b3999;
    }
    if ((b->backstep_on == true) &&
       ((local_30 < b->wolfe1_bound ||
        (b->previous_loss_sum <= b->loss_sum && b->loss_sum != b->previous_loss_sum)))) {
      ftime(&b->t_end_global);
      b->net_time = (double)(int)((double)((b->t_end_global).time - (b->t_start_global).time) *
                                  1000.0 + (double)(int)((uint)(b->t_end_global).millitm -
                                                        (uint)(b->t_start_global).millitm));
      if (all->quiet == false) {
        process_pass();
      }
      v_array<float>::clear(&b->predictions);
      update_weight(all,(float)(dVar5 - (double)b->step_size));
      b->step_size = (float)dVar5;
      zero_derivative(all);
      b->loss_sum = 0.0;
      goto LAB_001b35a4;
    }
    dVar5 = (b->previous_loss_sum - b->loss_sum) / b->previous_loss_sum;
    iVar3 = 0;
    if ((~(uint)(float)dVar5 & 0x7fc00000) != 0 && b->backstep_on == true) {
      if (ABS(dVar5) < (double)b->rel_threshold) {
        fprintf(_stdout,
                "\nTermination condition reached in pass %ld: decrease in loss less than %.3f%%.\nIf you want to optimize further, decrease termination threshold.\n"
                ,SUB84((double)b->rel_threshold * 100.0,0),b->current_pass + 1);
        iVar3 = 2;
      }
    }
    b->previous_loss_sum = b->loss_sum;
    b->loss_sum = 0.0;
    b->example_number = 0;
    b->curvature = 0.0;
    b->step_size = 1.0;
    bfgs_iter_middle(all,b,b->mem,b->rho,b->alpha,&b->lastj,&b->origin);
    if (all->hessian_on != true) {
      direction_magnitude(all);
      ftime(&b->t_end_global);
      b->net_time = (double)(int)((double)((b->t_end_global).time - (b->t_start_global).time) *
                                  1000.0 + (double)(int)((uint)(b->t_end_global).millitm -
                                                        (uint)(b->t_start_global).millitm));
      if (all->quiet == false) {
        process_pass();
      }
      v_array<float>::clear(&b->predictions);
      update_weight(all,b->step_size);
      goto LAB_001b3999;
    }
  }
  b->gradient_pass = false;
LAB_001b3999:
  b->current_pass = b->current_pass + 1;
  b->first_pass = false;
  b->preconditioner_pass = false;
  if ((b->output_regularizer == true) && (all->all_reduce != (AllReduce *)0x0)) {
    accumulate(all,&all->weights,3);
  }
  ftime(&b->t_end_global);
  b->net_time = (double)(int)((double)((b->t_end_global).time - (b->t_start_global).time) * 1000.0 +
                             (double)(int)((uint)(b->t_end_global).millitm -
                                          (uint)(b->t_start_global).millitm));
  if (all->save_per_pass == true) {
    pcVar1 = (all->final_regressor_name)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + (all->final_regressor_name)._M_string_length);
    save_predictor(all,&local_50,b->current_pass);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return iVar3;
}

Assistant:

int process_pass(vw& all, bfgs& b)
{
  int status = LEARN_OK;

  finalize_preconditioner(all, b, all.l2_lambda);
  /********************************************************************/
  /* A) FIRST PASS FINISHED: INITIALIZE FIRST LINE SEARCH *************/
  /********************************************************************/
  if (b.first_pass)
  {
    if (all.all_reduce != nullptr)
    {
      accumulate(all, all.weights, W_COND);  // Accumulate preconditioner
      float temp = (float)b.importance_weight_sum;
      b.importance_weight_sum = accumulate_scalar(all, temp);
    }
    // finalize_preconditioner(all, b, all.l2_lambda);
    if (all.all_reduce != nullptr)
    {
      float temp = (float)b.loss_sum;
      b.loss_sum = accumulate_scalar(all, temp);  // Accumulate loss_sums
      accumulate(all, all.weights, 1);            // Accumulate gradients from all nodes
    }
    if (all.l2_lambda > 0.)
      b.loss_sum += add_regularization(all, b, all.l2_lambda);
    if (!all.quiet)
      fprintf(stderr, "%2lu %-10.5f\t", (long unsigned int)b.current_pass + 1, b.loss_sum / b.importance_weight_sum);

    b.previous_loss_sum = b.loss_sum;
    b.loss_sum = 0.;
    b.example_number = 0;
    b.curvature = 0;
    bfgs_iter_start(all, b, b.mem, b.lastj, b.importance_weight_sum, b.origin);
    if (b.first_hessian_on)
    {
      b.gradient_pass = false;  // now start computing curvature
    }
    else
    {
      b.step_size = 0.5;
      float d_mag = direction_magnitude(all);
      ftime(&b.t_end_global);
      b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
          (b.t_end_global.millitm - b.t_start_global.millitm));
      if (!all.quiet)
        fprintf(stderr, "%-10s\t%-10.5f\t%-.5f\n", "", d_mag, b.step_size);
      b.predictions.clear();
      update_weight(all, b.step_size);
    }
  }
  else
      /********************************************************************/
      /* B) GRADIENT CALCULATED *******************************************/
      /********************************************************************/
      if (b.gradient_pass)  // We just finished computing all gradients
  {
    if (all.all_reduce != nullptr)
    {
      float t = (float)b.loss_sum;
      b.loss_sum = accumulate_scalar(all, t);  // Accumulate loss_sums
      accumulate(all, all.weights, 1);         // Accumulate gradients from all nodes
    }
    if (all.l2_lambda > 0.)
      b.loss_sum += add_regularization(all, b, all.l2_lambda);
    if (!all.quiet)
    {
      if (!all.holdout_set_off && b.current_pass >= 1)
      {
        if (all.sd->holdout_sum_loss_since_last_pass == 0. && all.sd->weighted_holdout_examples_since_last_pass == 0.)
        {
          fprintf(stderr, "%2lu ", (long unsigned int)b.current_pass + 1);
          fprintf(stderr, "h unknown    ");
        }
        else
          fprintf(stderr, "%2lu h%-10.5f\t", (long unsigned int)b.current_pass + 1,
              all.sd->holdout_sum_loss_since_last_pass / all.sd->weighted_holdout_examples_since_last_pass);
      }
      else
        fprintf(stderr, "%2lu %-10.5f\t", (long unsigned int)b.current_pass + 1, b.loss_sum / b.importance_weight_sum);
    }
    double wolfe1;
    double new_step = wolfe_eval(
        all, b, b.mem, b.loss_sum, b.previous_loss_sum, b.step_size, b.importance_weight_sum, b.origin, wolfe1);

    /********************************************************************/
    /* B0) DERIVATIVE ZERO: MINIMUM FOUND *******************************/
    /********************************************************************/
    if (nanpattern((float)wolfe1))
    {
      fprintf(stderr, "\n");
      fprintf(stdout, "Derivative 0 detected.\n");
      b.step_size = 0.0;
      status = LEARN_CONV;
    }
    /********************************************************************/
    /* B1) LINE SEARCH FAILED *******************************************/
    /********************************************************************/
    else if (b.backstep_on && (wolfe1 < b.wolfe1_bound || b.loss_sum > b.previous_loss_sum))
    {
      // curvature violated, or we stepped too far last time: step back
      ftime(&b.t_end_global);
      b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
          (b.t_end_global.millitm - b.t_start_global.millitm));
      float ratio = (b.step_size == 0.f) ? 0.f : (float)new_step / (float)b.step_size;
      if (!all.quiet)
        fprintf(stderr, "%-10s\t%-10s\t(revise x %.1f)\t%-.5f\n", "", "", ratio, new_step);
      b.predictions.clear();
      update_weight(all, (float)(-b.step_size + new_step));
      b.step_size = (float)new_step;
      zero_derivative(all);
      b.loss_sum = 0.;
    }

    /********************************************************************/
    /* B2) LINE SEARCH SUCCESSFUL OR DISABLED          ******************/
    /*     DETERMINE NEXT SEARCH DIRECTION             ******************/
    /********************************************************************/
    else
    {
      double rel_decrease = (b.previous_loss_sum - b.loss_sum) / b.previous_loss_sum;
      if (!nanpattern((float)rel_decrease) && b.backstep_on && fabs(rel_decrease) < b.rel_threshold)
      {
        fprintf(stdout,
            "\nTermination condition reached in pass %ld: decrease in loss less than %.3f%%.\n"
            "If you want to optimize further, decrease termination threshold.\n",
            (long int)b.current_pass + 1, b.rel_threshold * 100.0);
        status = LEARN_CONV;
      }
      b.previous_loss_sum = b.loss_sum;
      b.loss_sum = 0.;
      b.example_number = 0;
      b.curvature = 0;
      b.step_size = 1.0;

      try
      {
        bfgs_iter_middle(all, b, b.mem, b.rho, b.alpha, b.lastj, b.origin);
      }
      catch (const curv_exception&)
      {
        fprintf(stdout, "In bfgs_iter_middle: %s", curv_message);
        b.step_size = 0.0;
        status = LEARN_CURV;
      }

      if (all.hessian_on)
      {
        b.gradient_pass = false;  // now start computing curvature
      }
      else
      {
        float d_mag = direction_magnitude(all);
        ftime(&b.t_end_global);
        b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
            (b.t_end_global.millitm - b.t_start_global.millitm));
        if (!all.quiet)
          fprintf(stderr, "%-10s\t%-10.5f\t%-.5f\n", "", d_mag, b.step_size);
        b.predictions.clear();
        update_weight(all, b.step_size);
      }
    }
  }

  /********************************************************************/
  /* C) NOT FIRST PASS, CURVATURE CALCULATED **************************/
  /********************************************************************/
  else  // just finished all second gradients
  {
    if (all.all_reduce != nullptr)
    {
      float t = (float)b.curvature;
      b.curvature = accumulate_scalar(all, t);  // Accumulate curvatures
    }
    if (all.l2_lambda > 0.)
      b.curvature += regularizer_direction_magnitude(all, b, all.l2_lambda);
    float dd = (float)derivative_in_direction(all, b, b.mem, b.origin);
    if (b.curvature == 0. && dd != 0.)
    {
      fprintf(stdout, "%s", curv_message);
      b.step_size = 0.0;
      status = LEARN_CURV;
    }
    else if (dd == 0.)
    {
      fprintf(stdout, "Derivative 0 detected.\n");
      b.step_size = 0.0;
      status = LEARN_CONV;
    }
    else
      b.step_size = -dd / (float)b.curvature;

    float d_mag = direction_magnitude(all);

    b.predictions.clear();
    update_weight(all, b.step_size);
    ftime(&b.t_end_global);
    b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
        (b.t_end_global.millitm - b.t_start_global.millitm));

    if (!all.quiet)
      fprintf(stderr, "%-10.5f\t%-10.5f\t%-.5f\n", b.curvature / b.importance_weight_sum, d_mag, b.step_size);
    b.gradient_pass = true;
  }  // now start computing derivatives.
  b.current_pass++;
  b.first_pass = false;
  b.preconditioner_pass = false;

  if (b.output_regularizer)  // need to accumulate and place the regularizer.
  {
    if (all.all_reduce != nullptr)
      accumulate(all, all.weights, W_COND);  // Accumulate preconditioner
    // preconditioner_to_regularizer(all, b, all.l2_lambda);
  }
  ftime(&b.t_end_global);
  b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
      (b.t_end_global.millitm - b.t_start_global.millitm));

  if (all.save_per_pass)
    save_predictor(all, all.final_regressor_name, b.current_pass);
  return status;
}